

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

BasicHandleInfo * __thiscall
helics::HandleManager::addHandle
          (HandleManager *this,GlobalFederateId fed_id,InterfaceHandle local_id,InterfaceType what,
          string_view key,string_view type,string_view units)

{
  bool bVar1;
  reference pvVar2;
  GlobalFederateId *in_RDI;
  string actKey;
  int32_t index;
  int32_t in_stack_000003a4;
  BasicHandleInfo *in_stack_000003a8;
  HandleManager *in_stack_000003b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  InterfaceType *__args_2;
  InterfaceHandle *__args_1;
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffb7;
  HandleManager *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __args_2 = &stack0x00000018;
  __args_1 = (InterfaceHandle *)&stack0x00000008;
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
            ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)0x62d899);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  bVar3 = 0;
  if (bVar1) {
    generateName_abi_cxx11_(in_stack_ffffffffffffffb8,(InterfaceType)in_stack_ffffffffffffffb7);
  }
  else {
    in_stack_ffffffffffffff80 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffb7;
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(1,in_stack_ffffffffffffffb0)),
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  }
  std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>::
  emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle&,helics::InterfaceType&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
             in_stack_ffffffffffffffa0,in_RDI,__args_1,__args_2,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(bVar3,in_stack_ffffffffffffffb0)));
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::back
            ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
             in_stack_ffffffffffffff80);
  addSearchFields(in_stack_000003b0,in_stack_000003a8,in_stack_000003a4);
  pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::back
                     ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
                      in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  return pvVar2;
}

Assistant:

BasicHandleInfo& HandleManager::addHandle(GlobalFederateId fed_id,
                                          InterfaceHandle local_id,
                                          InterfaceType what,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    auto index = static_cast<int32_t>(handles.size());
    const std::string actKey = (!key.empty()) ? std::string{key} : generateName(what);
    handles.emplace_back(fed_id, local_id, what, actKey, type, units);
    addSearchFields(handles.back(), index);
    return handles.back();
}